

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::_::
CopyConstructArray_<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  Entry *this_00;
  
  while (this->start < this->pos) {
    this_00 = this->pos + -1;
    this->pos = this_00;
    HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry::~Entry(this_00);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }